

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GetCrossFileReferencesForFile
          (FileGenerator *this,FileDescriptor *file,CrossFileReferences *refs)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  FileDescriptor *dep_00;
  pair<absl::lts_20240722::container_internal::btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>,_const_google::protobuf::FileDescriptor_*const_&,_const_google::protobuf::FileDescriptor_*const_*>,_bool>
  local_70;
  pair<absl::lts_20240722::container_internal::btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>,_const_google::protobuf::FileDescriptor_*const_&,_const_google::protobuf::FileDescriptor_*const_*>,_bool>
  local_58;
  FileDescriptor *local_40;
  FileDescriptor *dep;
  undefined1 auStack_30 [4];
  int i;
  CrossFileReferences *local_28;
  CrossFileReferences *local_20;
  CrossFileReferences *refs_local;
  FileDescriptor *file_local;
  FileGenerator *this_local;
  
  _auStack_30 = this;
  local_28 = refs;
  local_20 = refs;
  refs_local = (CrossFileReferences *)file;
  file_local = (FileDescriptor *)this;
  ForEachField<google::protobuf::compiler::cpp::FileGenerator::GetCrossFileReferencesForFile(google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences*)::__0>
            (file,(anon_class_16_2_3fe543fb *)auStack_30);
  bVar2 = HasDescriptorMethods((FileDescriptor *)refs_local,&this->options_);
  if (bVar2) {
    for (dep._4_4_ = 0; iVar1 = dep._4_4_,
        iVar3 = FileDescriptor::dependency_count((FileDescriptor *)refs_local), iVar1 < iVar3;
        dep._4_4_ = dep._4_4_ + 1) {
      local_40 = (FileDescriptor *)google::protobuf::FileDescriptor::dependency((int)refs_local);
      dep_00 = (FileDescriptor *)google::protobuf::FileDescriptor::dependency((int)refs_local);
      bVar2 = ShouldSkipDependencyImports(this,dep_00);
      if (bVar2) {
        bVar2 = IsDepWeak(this,local_40);
        if (bVar2) {
          absl::lts_20240722::container_internal::
          btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
          ::insert(&local_70,
                   &(local_20->weak_reflection_files).
                    super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
                   ,&local_40);
        }
      }
      else {
        absl::lts_20240722::container_internal::
        btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
        ::insert(&local_58,
                 &(local_20->strong_reflection_files).
                  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
                 ,&local_40);
      }
    }
  }
  return;
}

Assistant:

void FileGenerator::GetCrossFileReferencesForFile(const FileDescriptor* file,
                                                  CrossFileReferences* refs) {
  ForEachField(file, [this, refs](const FieldDescriptor* field) {
    GetCrossFileReferencesForField(field, refs);
  });

  if (!HasDescriptorMethods(file, options_)) {
    return;
  }

  for (int i = 0; i < file->dependency_count(); ++i) {
    const FileDescriptor* dep = file->dependency(i);

    if (!ShouldSkipDependencyImports(file->dependency(i))) {
      refs->strong_reflection_files.insert(dep);
    } else if (IsDepWeak(dep)) {
      refs->weak_reflection_files.insert(dep);
    }
  }
}